

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O1

void __thiscall OpenMD::DataStorage::DataStorage(DataStorage *this,size_t size,int storageLayout)

{
  memset(this,0,0x1b0);
  this->size_ = size;
  this->storageLayout_ = storageLayout;
  resize(this,size);
  resize(this,size);
  return;
}

Assistant:

DataStorage::DataStorage(std::size_t size, int storageLayout) : size_(size) {
    setStorageLayout(storageLayout);
    resize(size);
  }